

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

void __thiscall
helics::CoreFactory::abortAllCores(CoreFactory *this,int errorCode,string_view errorString)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer psVar3;
  string_view fmt;
  format_args args;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> cores;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  size_t local_58;
  undefined8 local_50;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> local_48;
  
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::getObjects
            (&local_48,(SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores);
  for (psVar3 = local_48.
                super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar3 != local_48.
                super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
    peVar1 = (psVar3->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*peVar1->_vptr_Core[0xc])(peVar1);
    local_68 = *(undefined8 *)CONCAT44(extraout_var,iVar2);
    uStack_60 = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x1b;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    local_58 = errorString._M_len;
    local_50 = CONCAT44(in_register_00000034,errorCode);
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"{} sent abort message: \'{}\'",fmt,args);
    (*peVar1->_vptr_Core[0xe])
              (peVar1,0xfffffefd,(ulong)this & 0xffffffff,local_88._M_string_length,
               local_88._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    (*((psVar3->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Core[8]
    )();
  }
  gmlc::concurrency::DelayedDestructor<helics::Core>::destroyObjects
            ((DelayedDestructor<helics::Core> *)delayedDestroyer,(milliseconds)0xfa);
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
  ~vector(&local_48);
  return;
}

Assistant:

void abortAllCores(int errorCode, std::string_view errorString)
{
    auto cores = searchableCores.getObjects();
    for (auto& core : cores) {
        core->globalError(gLocalCoreId,
                          errorCode,
                          fmt::format("{} sent abort message: '{}'",
                                      core->getIdentifier(),
                                      errorString));

        core->disconnect();
    }
    cleanUpCores(std::chrono::milliseconds(250));
}